

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto.c
# Opt level: O1

psa_status_t
psa_key_derivation_set_capacity(psa_key_derivation_operation_t *operation,size_t capacity)

{
  psa_status_t pVar1;
  
  if (operation->alg != 0) {
    pVar1 = -0x87;
    if (capacity <= operation->capacity) {
      operation->capacity = capacity;
      pVar1 = 0;
    }
    return pVar1;
  }
  return -0x89;
}

Assistant:

psa_status_t psa_key_derivation_set_capacity( psa_key_derivation_operation_t *operation,
                                         size_t capacity )
{
    if( operation->alg == 0 )
        return( PSA_ERROR_BAD_STATE );
    if( capacity > operation->capacity )
        return( PSA_ERROR_INVALID_ARGUMENT );
    operation->capacity = capacity;
    return( PSA_SUCCESS );
}